

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O2

void __thiscall brown::Tile::Tile(Tile *this,int x,int y,uint32_t fill)

{
  uintptr_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  Tile(this,x,y);
  uVar1 = this->f;
  uVar2 = 0;
  uVar3 = (ulong)(uint)(y * x);
  if (y * x < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    *(uint32_t *)(uVar1 + uVar2 * 4) = fill;
  }
  return;
}

Assistant:

Tile::Tile(int x, int y, std::uint32_t fill):
    Tile(x, y) {
    for (int i = 0; i <  x*y; i++) {
        reinterpret_cast<std::uint32_t*>(f)[i] = fill;
    }
}